

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_management.c
# Opt level: O1

void on_message_send_complete
               (void *context,MESSAGE_SEND_RESULT send_result,AMQP_VALUE delivery_state)

{
  long lVar1;
  int iVar2;
  undefined8 *puVar3;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  char *pcVar4;
  
  if (context == (void *)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      pcVar4 = "NULL context";
      iVar2 = 0x169;
LAB_0012ab3b:
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                 ,"on_message_send_complete",iVar2,1,pcVar4);
      return;
    }
  }
  else {
    puVar3 = (undefined8 *)singlylinkedlist_item_get_value((LIST_ITEM_HANDLE)context);
    if (send_result != MESSAGE_SEND_CANCELLED) {
      if (send_result == MESSAGE_SEND_OK) {
        *(undefined1 *)(puVar3 + 3) = 1;
        puVar3[5] = 0;
      }
      else {
        lVar1 = puVar3[4];
        iVar2 = singlylinkedlist_remove
                          (*(SINGLYLINKEDLIST_HANDLE *)(lVar1 + 0x20),(LIST_ITEM_HANDLE)context);
        if (iVar2 == 0) {
          if ((code *)*puVar3 != (code *)0x0) {
            (*(code *)*puVar3)(puVar3[1],2,0,0,0);
          }
          async_operation_destroy((ASYNC_OPERATION_HANDLE)puVar3[6]);
          return;
        }
        (**(code **)(lVar1 + 0x40))();
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          pcVar4 = "Cannot remove pending operation";
          iVar2 = 0x187;
          goto LAB_0012ab3b;
        }
      }
    }
  }
  return;
}

Assistant:

static void on_message_send_complete(void* context, MESSAGE_SEND_RESULT send_result, AMQP_VALUE delivery_state)
{
    (void)delivery_state;

    if (context == NULL)
    {
        /* Codes_SRS_AMQP_MANAGEMENT_01_167: [ When `on_message_send_complete` is called with a NULL context it shall return. ]*/
        LogError("NULL context");
    }
    else
    {
        /* Codes_SRS_AMQP_MANAGEMENT_01_168: [ - `context` shall be used as a LIST_ITEM_HANDLE containing the pending operation. ]*/
        LIST_ITEM_HANDLE pending_operation_list_item_handle = (LIST_ITEM_HANDLE)context;

        /* Codes_SRS_AMQP_MANAGEMENT_01_169: [ - `on_message_send_complete` shall obtain the pending operation by calling `singlylinkedlist_item_get_value`. ]*/
        OPERATION_MESSAGE_INSTANCE* pending_operation_message = (OPERATION_MESSAGE_INSTANCE*)singlylinkedlist_item_get_value(pending_operation_list_item_handle);

        if (send_result == MESSAGE_SEND_OK)
        {
            /* Codes_SRS_AMQP_MANAGEMENT_01_170: [ If `send_result` is `MESSAGE_SEND_OK`, `on_message_send_complete` shall return. ]*/
            pending_operation_message->message_send_confirmed = true;
            pending_operation_message->send_async_context = NULL;
        }
        else if (send_result == MESSAGE_SEND_CANCELLED)
        {
            // Nothing to be done.
        }
        else
        {
            /* Codes_SRS_AMQP_MANAGEMENT_01_172: [ If `send_result` is different then `MESSAGE_SEND_OK`: ]*/
            AMQP_MANAGEMENT_HANDLE amqp_management = pending_operation_message->amqp_management;

            /* Codes_SRS_AMQP_MANAGEMENT_01_171: [ - `on_message_send_complete` shall removed the pending operation from the pending operations list. ]*/
            if (singlylinkedlist_remove(amqp_management->pending_operations, pending_operation_list_item_handle) != 0)
            {
                /* Tests_SRS_AMQP_MANAGEMENT_01_174: [ If any error occurs in removing the pending operation from the list `on_amqp_management_error` callback shall be invoked while passing the `on_amqp_management_error_context` as argument. ]*/
                amqp_management->on_amqp_management_error(amqp_management->on_amqp_management_error_context);
                LogError("Cannot remove pending operation");
            }
            else
            {
                /* Codes_SRS_AMQP_MANAGEMENT_01_173: [ - The callback associated with the pending operation shall be called with `AMQP_MANAGEMENT_EXECUTE_OPERATION_ERROR`. ]*/
                if (pending_operation_message->on_execute_operation_complete != NULL)
                {
                    // Check for NULL in case operation has been cancelled.
                    pending_operation_message->on_execute_operation_complete(pending_operation_message->callback_context, AMQP_MANAGEMENT_EXECUTE_OPERATION_ERROR, 0, NULL, NULL);
                }

                async_operation_destroy(pending_operation_message->execute_async_operation);
            }
        }
    }
}